

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

string * test_sprintf<>(string_view format)

{
  string *in_RDI;
  basic_string_view<char> *in_stack_00000028;
  
  fmt::v5::sprintf<fmt::v5::basic_string_view<char>>(in_stack_00000028);
  return in_RDI;
}

Assistant:

std::string test_sprintf(fmt::string_view format, const Args &... args) {
  return fmt::sprintf(format, args...);
}